

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.c
# Opt level: O0

lexicon_t * lexicon_read(lexicon_t *prior_lex,char *filename,acmod_set_t *acmod_set)

{
  uint32 uVar1;
  int iVar2;
  int32 iVar3;
  FILE *__stream;
  lex_entry_t *e;
  char *pcVar4;
  char *word;
  int reuse_entry;
  uint32 lineno;
  uint32 n_phone;
  uint32 start_wid;
  uint32 wid;
  lex_entry_t *next_entry;
  lexicon_t *lex;
  char *lex_line;
  lineiter_t *line;
  FILE *lex_fp;
  acmod_set_t *acmod_set_local;
  char *filename_local;
  lexicon_t *prior_lex_local;
  
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    next_entry = (lex_entry_t *)prior_lex;
    if (prior_lex == (lexicon_t *)0x0) {
      next_entry = (lex_entry_t *)lexicon_new();
    }
    if (next_entry->phone == (char **)0x0) {
      next_entry->phone = (char **)acmod_set;
    }
    uVar1 = *(uint32 *)&next_entry->ortho;
    lex_line = (char *)lineiter_start_clean((FILE *)__stream);
    n_phone = uVar1;
    for (; lex_line != (char *)0x0; lex_line = (char *)lineiter_next((lineiter_t *)lex_line)) {
      if (**(char **)lex_line == '\0') {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                ,0xb1,"Dictionary file \'%s\' has a blank line at line %d\n",filename,0);
      }
      else {
        e = lexicon_append_entry((lexicon_t *)next_entry);
        pcVar4 = strdup(*(char **)lex_line);
        pcVar4 = strtok(pcVar4," \t");
        iVar2 = add_word(pcVar4,n_phone,(lexicon_t *)next_entry,e);
        if (iVar2 == 0) {
          iVar3 = str2words(*(char **)lex_line,(char **)0x0,0);
          iVar2 = add_phones(iVar3 - 1,e,acmod_set);
          if (iVar2 == 0) {
            hash_table_enter(*(hash_table_t **)&next_entry->word_id,e->ortho,e);
            n_phone = n_phone + 1;
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                    ,0xd3,"pronunciation for %s has undefined phones; skipping.\n",pcVar4);
            lexicon_entry_free(e);
          }
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                  ,0xc4,"%s duplicate entry?\n",pcVar4);
          lexicon_entry_free(e);
        }
      }
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
            ,0xdd,"%d entries added from %s\n",(ulong)(n_phone - uVar1),filename);
    lineiter_free((lineiter_t *)0x0);
    fclose(__stream);
    return (lexicon_t *)next_entry;
  }
  err_msg_system(ERR_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                 ,0xa1,"Unable to open dictionary file \'%s\' for reading\n",filename);
  exit(1);
}

Assistant:

lexicon_t *lexicon_read(lexicon_t *prior_lex,
			const char *filename,
			acmod_set_t *acmod_set)
{
    FILE *lex_fp;
    lineiter_t *line = NULL;
    char *lex_line;
    lexicon_t *lex;
    lex_entry_t *next_entry = NULL;
    uint32    wid, start_wid;
    uint32    n_phone;
    uint32    lineno = 0;
    int       reuse_entry = FALSE;
    char      *word;

    lex_fp = fopen(filename, "r");
    if (lex_fp == NULL) {
	E_FATAL_SYSTEM("Unable to open dictionary file '%s' for reading\n",
		       filename);
    }

    if (prior_lex)
	lex = prior_lex;
    else
	lex = lexicon_new();

    if (lex->phone_set == NULL)
	lex->phone_set = acmod_set;

    start_wid = wid = lex->entry_cnt;
    for (line = lineiter_start_clean(lex_fp); line; line = lineiter_next(line)) {

	if (line->buf[0] == 0) {
	    E_WARN("Dictionary file '%s' has a blank line at line %d\n",
		   filename, lineno);
	    continue;
	}
	
	next_entry = lexicon_append_entry(lex);

	/* allocate space for string.  It will be parsed
	 * by strtok() */
	lex_line = strdup(line->buf);

	/* get the word and make a hash table entry for
	   this lexicon entry */

	word = strtok(lex_line, " \t");	

	if (add_word(word,
		     wid,
		     lex,
		     next_entry) != S3_SUCCESS) {
	    E_ERROR("%s duplicate entry?\n", word);
	    lexicon_entry_free(next_entry);
	    continue;
	}

	/* str2words() counts the # of space separated "words" on a line */
	n_phone = str2words(line->buf, NULL, 0) - 1;

#ifdef LEXICON_VERBOSE
	E_INFO("%s %d phones\n", line->buf, n_phone);
#endif

	/* read the phones, convert to ids and add them
	   to the phone list for this entry */
	if (add_phones(n_phone, next_entry, acmod_set) != S3_SUCCESS) {
	    E_ERROR("pronunciation for %s has undefined phones; skipping.\n", word);
	    lexicon_entry_free(next_entry);
	    continue;
	}
	
	hash_table_enter(lex->ht, next_entry->ortho, (void *)next_entry);
	++wid;	/* only happens should everything be successful */
    }

    E_INFO("%d entries added from %s\n",
	   wid - start_wid, filename);
			  
    lineiter_free(line);
    fclose(lex_fp);
    
    return lex;
}